

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O2

void vocdelinh(voccxdef *ctx)

{
  vocdef *pvVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  vocdef *pvVar6;
  vocdef **ppvVar7;
  uint *puVar8;
  uint uVar9;
  vocdef *pvVar10;
  vocdef **ppvVar11;
  uint *puVar12;
  bool bVar13;
  
  ppvVar7 = ctx->voccxhsh;
  iVar3 = 0x100;
  do {
    bVar13 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar13) {
      return;
    }
    pvVar1 = *ppvVar7;
    pvVar10 = (vocdef *)(vocdef **)0x0;
LAB_0011959b:
    pvVar6 = pvVar1;
    if (pvVar6 != (vocdef *)0x0) {
      pvVar1 = pvVar6->vocnxt;
      uVar9 = pvVar6->vocwlst;
      if (uVar9 == 0xffffffff) {
        puVar4 = (uint *)0x0;
      }
      else {
        puVar4 = (uint *)((long)&ctx->voccxwp[(ulong)uVar9 / 2000]->vocwnxt +
                         (ulong)(uVar9 % 2000 << 3));
      }
      ppvVar11 = &pvVar10->vocnxt;
      if (pvVar10 == (vocdef *)0x0) {
        ppvVar11 = ppvVar7;
      }
      bVar13 = false;
      puVar12 = (uint *)0x0;
      do {
        puVar5 = puVar4;
        uVar2 = uVar9;
        puVar8 = puVar12;
        if (puVar12 == (uint *)0x0) {
          puVar8 = &pvVar6->vocwlst;
        }
        while( true ) {
          if (puVar5 == (uint *)0x0) {
            if (!bVar13) {
              pvVar10 = pvVar6;
            }
            goto LAB_0011959b;
          }
          uVar9 = *puVar5;
          if (uVar9 == 0xffffffff) {
            puVar4 = (uint *)0x0;
          }
          else {
            puVar4 = (uint *)((long)&ctx->voccxwp[(ulong)uVar9 / 2000]->vocwnxt +
                             (ulong)(uVar9 % 2000 << 3));
          }
          puVar12 = puVar5;
          if ((*(byte *)((long)puVar5 + 7) & 2) == 0) break;
          *puVar8 = uVar9;
          *puVar5 = ctx->voccxwfre;
          ctx->voccxwfre = uVar2;
          puVar5 = puVar4;
          uVar2 = uVar9;
          if (pvVar6->vocwlst == 0xffffffff) {
            *ppvVar11 = pvVar6->vocnxt;
            pvVar6->vocnxt = ctx->voccxfre;
            ctx->voccxfre = pvVar6;
            bVar13 = true;
          }
        }
      } while( true );
    }
    ppvVar7 = ppvVar7 + 1;
  } while( true );
}

Assistant:

void vocdelinh(voccxdef *ctx)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      idx;
    uint      nxtidx;
    int       deleted_vocdef;
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            nxt = v->vocnxt;
            deleted_vocdef = FALSE;

            /* go through each vocwdef relation in the word's list */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember the next item in the vocwdef list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /* delete word if it's inherited */
                if (vw->vocwflg & VOCFINH)
                {
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        /* unlink from hash chain */
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                        
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                    prvw = vw;  /* this one is still in list - it's now prv */
            }

            /* if we didn't delete this vocdef, advance prv onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}